

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::Player(Player *this,int min,int max)

{
  BlackCard *card;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  iterator iVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  Stronghold *pSVar5;
  DeckBuilder *this_00;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *this_01;
  size_type sVar6;
  reference ppBVar7;
  reference ppGVar8;
  string *local_320;
  GreenCard *newCard_5;
  int local_234;
  int i;
  BlackCard *newCard_4;
  BlackCard *newCard_3;
  _List_node_base *local_1f8;
  _List_node_base *local_1f0;
  _List_node_base *local_1e8;
  BlackCard *local_1e0;
  BlackCard *newCard_2;
  _List_node_base *local_1d0;
  _List_node_base *local_1c8;
  _List_node_base *local_1c0;
  GreenCard *local_1b8;
  GreenCard *newCard_1;
  _List_node_base *local_1a8;
  _List_node_base *local_1a0;
  _List_node_base *local_198;
  GreenCard *local_190;
  GreenCard *newCard;
  _List_node_base *local_180;
  _Self local_178;
  iterator it1;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *black;
  iterator it;
  list<GreenCard_*,_std::allocator<GreenCard_*>_> *green;
  DeckBuilder *build;
  int count;
  allocator local_144;
  allocator local_143;
  allocator local_142;
  allocator local_141;
  string *local_140;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  int local_18;
  int local_14;
  int max_local;
  int min_local;
  Player *this_local;
  
  this->stronghold = (Stronghold *)0x0;
  local_18 = max;
  local_14 = min;
  _max_local = this;
  FateDeck::FateDeck(&this->fateDeck);
  DynastyDeck::DynastyDeck(&this->dynDeck);
  DynastyDeck::DynastyDeck(&this->provinces);
  Deck::Deck(&this->hand);
  DynastyDeck::DynastyDeck(&this->holdings);
  DynastyDeck::DynastyDeck(&this->army);
  build._7_1_ = 1;
  local_140 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"Golden Plains Outpost",&local_141);
  local_140 = local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"High House of Light",&local_142);
  local_140 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"Closed Shell Castle",&local_143);
  local_140 = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Mountain\'s Anvil Castle",&local_144);
  local_140 = local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Seven Strings Keep",(allocator *)((long)&count + 3));
  local_140 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"City of the Open Hand",(allocator *)((long)&count + 2));
  local_140 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Shiro City",(allocator *)((long)&count + 1));
  local_140 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"Red Fort",(allocator *)&count);
  build._7_1_ = 0;
  local_38 = (iterator)local_138;
  local_30 = 8;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&build + 6));
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->names,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&build + 6));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&build + 6));
  local_320 = (string *)&local_38;
  do {
    local_320 = local_320 + -0x20;
    std::__cxx11::string::~string(local_320);
  } while (local_320 != local_138);
  std::allocator<char>::~allocator((allocator<char> *)&count);
  std::allocator<char>::~allocator((allocator<char> *)((long)&count + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&count + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&count + 3));
  std::allocator<char>::~allocator((allocator<char> *)&local_144);
  std::allocator<char>::~allocator((allocator<char> *)&local_143);
  std::allocator<char>::~allocator((allocator<char> *)&local_142);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  pSVar5 = GenerateRandomStronghold(this);
  this->stronghold = pSVar5;
  iVar4 = (*(this->stronghold->super_BlackCard).super_Card._vptr_Card[6])();
  this->honour = iVar4;
  this->minCards = local_14;
  this->maxCards = local_18;
  this->numberOfProvinces = 4;
  this->maxHand = 6;
  build._0_4_ = 0;
  this_00 = (DeckBuilder *)operator_new(0x10);
  DeckBuilder::DeckBuilder(this_00);
  it._M_node = (_List_node_base *)DeckBuilder::createFateDeck_abi_cxx11_(this_00);
  black = (list<BlackCard_*,_std::allocator<BlackCard_*>_> *)
          std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::begin
                    ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)it._M_node);
  DeckBuilder::deckShuffler(this_00,(list<GreenCard_*,_std::allocator<GreenCard_*>_> *)it._M_node);
  it1._M_node = (_List_node_base *)DeckBuilder::createDynastyDeck_abi_cxx11_(this_00);
  local_178._M_node =
       (_List_node_base *)
       std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin
                 ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)it1._M_node);
  DeckBuilder::deckShuffler(this_00,(list<BlackCard_*,_std::allocator<BlackCard_*>_> *)it1._M_node);
  local_180 = (_List_node_base *)
              std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::begin(it._M_node);
  black = (list<BlackCard_*,_std::allocator<BlackCard_*>_> *)local_180;
  while( true ) {
    newCard = (GreenCard *)
              std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::end
                        ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)it._M_node);
    bVar3 = std::operator!=((_Self *)&black,(_Self *)&newCard);
    if ((!bVar3) || ((int)build == this->maxCards)) break;
    ppGVar8 = std::_List_iterator<GreenCard_*>::operator*((_List_iterator<GreenCard_*> *)&black);
    local_190 = *ppGVar8;
    FateDeck::pushCard(&this->fateDeck,local_190);
    iVar2 = it;
    ppGVar8 = std::_List_iterator<GreenCard_*>::operator*((_List_iterator<GreenCard_*> *)&black);
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
              ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)iVar2._M_node,(char *)ppGVar8);
    build._0_4_ = (int)build + 1;
    local_190 = (GreenCard *)0x0;
    local_198 = (_List_node_base *)
                std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::begin(it._M_node);
    black = (list<BlackCard_*,_std::allocator<BlackCard_*>_> *)local_198;
    local_1a0 = (_List_node_base *)
                std::_List_iterator<GreenCard_*>::operator++
                          ((_List_iterator<GreenCard_*> *)&black,0);
  }
  if ((int)build < this->minCards) {
    it._M_node = (_List_node_base *)DeckBuilder::createFateDeck_abi_cxx11_(this_00);
    DeckBuilder::deckShuffler(this_00,(list<GreenCard_*,_std::allocator<GreenCard_*>_> *)it._M_node)
    ;
    local_1a8 = (_List_node_base *)
                std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::begin(it._M_node);
    black = (list<BlackCard_*,_std::allocator<BlackCard_*>_> *)local_1a8;
    while( true ) {
      newCard_1 = (GreenCard *)
                  std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::end
                            ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)it._M_node);
      bVar3 = std::operator!=((_Self *)&black,(_Self *)&newCard_1);
      if ((!bVar3) || ((int)build == this->maxCards)) break;
      ppGVar8 = std::_List_iterator<GreenCard_*>::operator*((_List_iterator<GreenCard_*> *)&black);
      local_1b8 = *ppGVar8;
      FateDeck::pushCard(&this->fateDeck,local_1b8);
      iVar2 = it;
      ppGVar8 = std::_List_iterator<GreenCard_*>::operator*((_List_iterator<GreenCard_*> *)&black);
      std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
                ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)iVar2._M_node,(char *)ppGVar8);
      build._0_4_ = (int)build + 1;
      if (local_1b8 != (GreenCard *)0x0) {
        (*(local_1b8->super_Card)._vptr_Card[3])();
      }
      local_1c0 = (_List_node_base *)
                  std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::begin(it._M_node);
      black = (list<BlackCard_*,_std::allocator<BlackCard_*>_> *)local_1c0;
      local_1c8 = (_List_node_base *)
                  std::_List_iterator<GreenCard_*>::operator++
                            ((_List_iterator<GreenCard_*> *)&black,0);
    }
  }
  local_1d0 = (_List_node_base *)
              std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin(it1._M_node);
  local_178._M_node = local_1d0;
  while( true ) {
    newCard_2 = (BlackCard *)
                std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::end
                          ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)it1._M_node);
    bVar3 = std::operator!=(&local_178,(_Self *)&newCard_2);
    if ((!bVar3) || ((int)build == this->maxCards)) break;
    ppBVar7 = std::_List_iterator<BlackCard_*>::operator*(&local_178);
    local_1e0 = *ppBVar7;
    DynastyDeck::pushCard(&this->dynDeck,local_1e0);
    iVar1 = it1;
    ppBVar7 = std::_List_iterator<BlackCard_*>::operator*(&local_178);
    std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
              ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)iVar1._M_node,(char *)ppBVar7);
    build._0_4_ = (int)build + 1;
    if (local_1e0 != (BlackCard *)0x0) {
      (*(local_1e0->super_Card)._vptr_Card[3])();
    }
    local_1e8 = (_List_node_base *)
                std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin(it1._M_node);
    local_178._M_node = local_1e8;
    local_1f0 = (_List_node_base *)std::_List_iterator<BlackCard_*>::operator++(&local_178,0);
  }
  if ((int)build < this->minCards) {
    it1._M_node = (_List_node_base *)DeckBuilder::createDynastyDeck_abi_cxx11_(this_00);
    DeckBuilder::deckShuffler
              (this_00,(list<BlackCard_*,_std::allocator<BlackCard_*>_> *)it1._M_node);
    local_1f8 = (_List_node_base *)
                std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin(it1._M_node);
    local_178._M_node = local_1f8;
    while( true ) {
      newCard_3 = (BlackCard *)
                  std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::end
                            ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)it1._M_node);
      bVar3 = std::operator!=(&local_178,(_Self *)&newCard_3);
      if ((!bVar3) || ((int)build == this->maxCards)) break;
      ppBVar7 = std::_List_iterator<BlackCard_*>::operator*(&local_178);
      card = *ppBVar7;
      DynastyDeck::pushCard(&this->dynDeck,card);
      iVar1 = it1;
      ppBVar7 = std::_List_iterator<BlackCard_*>::operator*(&local_178);
      std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
                ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)iVar1._M_node,(char *)ppBVar7);
      build._0_4_ = (int)build + 1;
      if (card != (BlackCard *)0x0) {
        (*(card->super_Card)._vptr_Card[3])();
      }
      local_178._M_node =
           (_List_node_base *)
           std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin(it1._M_node);
      std::_List_iterator<BlackCard_*>::operator++(&local_178,0);
    }
  }
  while( true ) {
    this_01 = DynastyDeck::getDynDeck_abi_cxx11_(&this->provinces);
    sVar6 = std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::size(this_01);
    if (4 < sVar6) break;
    DeckBuilder::deckShuffler
              (this_00,(list<BlackCard_*,_std::allocator<BlackCard_*>_> *)it1._M_node);
    bVar3 = std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::empty
                      ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)it1._M_node);
    if (bVar3) {
      it1._M_node = (_List_node_base *)DeckBuilder::createDynastyDeck_abi_cxx11_(this_00);
      DeckBuilder::deckShuffler
                (this_00,(list<BlackCard_*,_std::allocator<BlackCard_*>_> *)it1._M_node);
      local_178._M_node =
           (_List_node_base *)
           std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin(it1._M_node);
    }
    ppBVar7 = std::_List_iterator<BlackCard_*>::operator*(&local_178);
    DynastyDeck::pushCard(&this->provinces,*ppBVar7);
    iVar1 = it1;
    ppBVar7 = std::_List_iterator<BlackCard_*>::operator*(&local_178);
    std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
              ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)iVar1._M_node,(char *)ppBVar7);
    local_178._M_node =
         (_List_node_base *)
         std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin(it1._M_node);
  }
  for (local_234 = 0; local_234 < 3; local_234 = local_234 + 1) {
    DeckBuilder::deckShuffler(this_00,(list<GreenCard_*,_std::allocator<GreenCard_*>_> *)it._M_node)
    ;
    bVar3 = std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::empty
                      ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)it._M_node);
    if (bVar3) {
      it._M_node = (_List_node_base *)DeckBuilder::createFateDeck_abi_cxx11_(this_00);
      DeckBuilder::deckShuffler
                (this_00,(list<GreenCard_*,_std::allocator<GreenCard_*>_> *)it._M_node);
      black = (list<BlackCard_*,_std::allocator<BlackCard_*>_> *)
              std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::begin
                        ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)it._M_node);
    }
    ppGVar8 = std::_List_iterator<GreenCard_*>::operator*((_List_iterator<GreenCard_*> *)&black);
    Deck::pushCard(&this->hand,&(*ppGVar8)->super_Card);
    iVar2 = it;
    ppGVar8 = std::_List_iterator<GreenCard_*>::operator*((_List_iterator<GreenCard_*> *)&black);
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
              ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)iVar2._M_node,(char *)ppGVar8);
    black = (list<BlackCard_*,_std::allocator<BlackCard_*>_> *)
            std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::begin
                      ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)it._M_node);
  }
  if (this_00 != (DeckBuilder *)0x0) {
    DeckBuilder::~DeckBuilder(this_00);
    operator_delete(this_00,0x10);
  }
  return;
}

Assistant:

Player::Player(int min, int max)
{
    stronghold = GenerateRandomStronghold();
    honour = stronghold->getHonour();

    minCards = min;
    maxCards = max;
    numberOfProvinces = 4;
    maxHand = 6;

    int count = 0;

    //creates general decks with all the cards and shuffles them
    DeckBuilder *build = new DeckBuilder();

    list<GreenCard*> *green = build->createFateDeck();
    list<GreenCard*>::iterator it = green->begin();
    build->deckShuffler(green);

    list<BlackCard*> *black = build->createDynastyDeck();
    list<BlackCard*>::iterator it1 = black->begin();
    build->deckShuffler(black);

    //creates fateDeck with num E[minCards, maxCards] cards from green
    for (it=green->begin(); it!=green->end(); it++)
    {
        if (count == maxCards)
            break;

        GreenCard *newCard = *it;
        fateDeck.pushCard(newCard);

        green->remove(*it);
        count++;

        newCard = nullptr;
        delete newCard;
        it=green->begin();
    }
    if (count < minCards)           //if deck too small creates a new green deck and adds more
    {
        green = build->createFateDeck();
        build->deckShuffler(green);

        for (it=green->begin(); it!=green->end(); it++)
        {
            if (count == maxCards)
                break;

            GreenCard *newCard = *it;
            fateDeck.pushCard(newCard);

            green->remove(*it);
            count++;

            delete newCard;
            it=green->begin();
        }
    }

    //creates dynDeck with num E[minCards, maxCards] cards from black
    for (it1=black->begin(); it1!=black->end(); it1++)
    {
        if (count == maxCards)
            break;

        BlackCard *newCard = *it1;
        dynDeck.pushCard(newCard);

        black->remove(*it1);
        count++;

        delete newCard;
        it1=black->begin();
    }

    if (count < minCards)           //if deck too small creates a new green deck and adds more
    {
        black = build->createDynastyDeck();
        build->deckShuffler(black);

        for (it1=black->begin(); it1!=black->end(); it1++)
        {
            if (count == maxCards)
                break;

            BlackCard *newCard = *it1;
            dynDeck.pushCard(newCard);

            black->remove(*it1);
            count++;

            delete newCard;
            it1=black->begin();
        }
    }

    //creates provinces with first 4 cards of black
    while (provinces.getDynDeck().size() < 5)//4 cards + list.end()
    {
        build->deckShuffler(black);
        if (black->empty())                                 //if it empties generate a new black deck and shuffle it
        {
            black = build->createDynastyDeck();
            build->deckShuffler(black);
            it1 = black->begin();
        }

        BlackCard *newCard = *it1;
        provinces.pushCard(newCard);

        black->remove(*it1);
        it1=black->begin();
    }

    //builds hand with first 3 cards of green deck
    int i;
    for (i=0; i<3; i++)                                     //players start with 3 cards in their hand
    {
        build->deckShuffler(green);
        if (green->empty())                                 //if it empties generate a new green deck and shuffle it
        {
            green = build->createFateDeck();
            build->deckShuffler(green);
            it = green->begin();
        }
        GreenCard *newCard = *it;
        hand.pushCard(newCard);

        green->remove(*it);
        it = green->begin();
    }

    delete build;
}